

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O2

void do_cmd_study(command *cmd)

{
  _Bool _Var1;
  
  _Var1 = player_get_resume_normal_shape(player,cmd);
  if (!_Var1) {
    return;
  }
  _Var1 = flag_has_dbg((player->state).pflags,3,6,"player->state.pflags","(PF_CHOOSE_SPELLS)");
  if (_Var1) {
    do_cmd_study_spell(cmd);
    return;
  }
  do_cmd_study_book(cmd);
  return;
}

Assistant:

void do_cmd_study(struct command *cmd)
{
	if (!player_get_resume_normal_shape(player, cmd)) {
		return;
	}

	if (player_has(player, PF_CHOOSE_SPELLS))
		do_cmd_study_spell(cmd);
	else
		do_cmd_study_book(cmd);
}